

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int run_using_server_starter(char *h2o_cmd,char *config_file)

{
  h2o_context_t *phVar1;
  listener_config_t *plVar2;
  h2o_multithread_queue_t *phVar3;
  h2o_filecache_t *cache;
  anon_struct_968_4_e2476a95 *paVar4;
  size_t sVar5;
  FILE *__stream;
  void *__argv;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  int *piVar12;
  char *pcVar13;
  h2o_evloop_t *phVar14;
  pthread_t pVar15;
  h2o_socket_t *phVar16;
  size_t sVar17;
  listener_ctx_t *plVar18;
  h2o_socket_t **pphVar19;
  SSL_CTX *pSVar20;
  ulong new_capacity;
  h2o_hostconf_t **pphVar21;
  h2o_iovec_t *unaff_R14;
  listener_ctx_t *listeners;
  h2o_iovec_t hVar22;
  char host [1025];
  undefined8 uStackY_528;
  listener_ctx_t lStackY_520;
  h2o_iovec_t *phStackY_4f0;
  sockaddr_storage *psStackY_4e8;
  code *pcStackY_4e0;
  h2o_vector_t local_4c8;
  char *local_4a8;
  char *local_4a0;
  char local_498 [32];
  h2o_iovec_t local_478;
  char *local_468;
  size_t local_460;
  h2o_iovec_t local_458;
  char *local_448;
  size_t local_440;
  h2o_socket_t local_438 [10];
  
  local_4c8.entries = (char **)0x0;
  local_4c8.size = 0;
  local_4c8.capacity = 0;
  pcStackY_4e0 = (code *)0x18bb40;
  local_4a8 = h2o_cmd;
  local_4a0 = config_file;
  h2o_vector__expand((h2o_mem_pool_t *)0x0,&local_4c8,8,1);
  pcStackY_4e0 = (code *)0x18bb4c;
  pcVar8 = h2o_configurator_get_cmd_path("share/h2o/start_server");
  uVar9 = local_4c8.size + 1;
  *(char **)((long)local_4c8.entries + local_4c8.size * 8) = pcVar8;
  if (conf.pid_file != (char *)0x0) {
    new_capacity = local_4c8.size + 2;
    local_4c8.size = uVar9;
    if (local_4c8.capacity < new_capacity) {
      pcStackY_4e0 = (code *)0x18bb8a;
      h2o_vector__expand((h2o_mem_pool_t *)0x0,&local_4c8,8,new_capacity);
    }
    pcVar8 = conf.pid_file;
    unaff_R14 = &local_458;
    local_458.base = "--pid-file=";
    local_458.len = 0xb;
    pcStackY_4e0 = (code *)0x18bbb3;
    local_440 = strlen(conf.pid_file);
    local_448 = pcVar8;
    pcStackY_4e0 = (code *)0x18bbca;
    hVar22 = h2o_concat_list((h2o_mem_pool_t *)0x0,unaff_R14,2);
    uVar9 = local_4c8.size + 1;
    *(char **)((long)local_4c8.entries + local_4c8.size * 8) = hVar22.base;
  }
  local_4c8.size = uVar9;
  if (conf.error_log != (char *)0x0) {
    if (local_4c8.capacity < uVar9 + 1) {
      pcStackY_4e0 = (code *)0x18bc08;
      h2o_vector__expand((h2o_mem_pool_t *)0x0,&local_4c8,8,uVar9 + 1);
    }
    pcVar8 = conf.error_log;
    unaff_R14 = &local_478;
    local_478.base = "--log-file=";
    local_478.len = 0xb;
    pcStackY_4e0 = (code *)0x18bc2e;
    local_460 = strlen(conf.error_log);
    local_468 = pcVar8;
    pcStackY_4e0 = (code *)0x18bc45;
    hVar22 = h2o_concat_list((h2o_mem_pool_t *)0x0,unaff_R14,2);
    *(char **)((long)local_4c8.entries + local_4c8.size * 8) = hVar22.base;
    local_4c8.size = local_4c8.size + 1;
  }
  if (conf.run_mode == RUN_MODE_DAEMON) {
    uVar9 = local_4c8.size + 1;
    if (local_4c8.capacity < uVar9) {
      pcStackY_4e0 = (code *)0x18bc87;
      h2o_vector__expand((h2o_mem_pool_t *)0x0,&local_4c8,8,uVar9);
      uVar9 = local_4c8.size + 1;
    }
    *(char **)((long)local_4c8.entries + local_4c8.size * 8) = "--daemonize";
    local_4c8.size = uVar9;
  }
  if (conf.num_listeners != 0) {
    sVar17 = 0;
    do {
      plVar2 = conf.listeners[sVar17];
      if ((plVar2->addr).ss_family == 1) {
        pcVar8 = (plVar2->addr).__ss_padding;
        pcStackY_4e0 = (code *)0x18bcea;
        sVar10 = strlen(pcVar8);
        pcStackY_4e0 = (code *)0x18bcf3;
        unaff_R14 = (h2o_iovec_t *)malloc(sVar10 + 8);
        if (unaff_R14 == (h2o_iovec_t *)0x0) {
LAB_0018beca:
          pcStackY_4e0 = (code *)0x18bed6;
          h2o__fatal(
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:330:no memory"
                    );
        }
        pcStackY_4e0 = (code *)0x18bd13;
        sprintf((char *)unaff_R14,"--path=%s",pcVar8);
      }
      else {
        pcStackY_4e0 = (code *)0x18bd43;
        uVar6 = getnameinfo((sockaddr *)&plVar2->addr,plVar2->addrlen,(char *)local_438,0x401,
                            local_498,0x20,3);
        if (uVar6 != 0) {
          pSVar20 = (SSL_CTX *)(ulong)uVar6;
          pcStackY_4e0 = run_loop;
          run_using_server_starter_cold_1();
          sVar5 = conf.num_listeners;
          lStackY_520.accept_ctx.libmemcached_receiver = (h2o_multithread_receiver_t *)0x230129;
          listeners = &lStackY_520 + -conf.num_listeners;
          pphVar21 = (h2o_hostconf_t **)((long)pSVar20 * 0x3c8);
          paVar4 = conf.threads + (long)pSVar20;
          lStackY_520.accept_ctx.ssl_ctx = pSVar20;
          lStackY_520.accept_ctx._24_8_ = sVar17;
          lStackY_520.sock = local_438;
          phStackY_4f0 = unaff_R14;
          psStackY_4e8 = &plVar2->addr;
          pcStackY_4e0 = (code *)local_498;
          (&uStackY_528)[conf.num_listeners * -6] = 0x18bf2f;
          phVar14 = h2o_evloop_create();
          (&uStackY_528)[sVar5 * -6] = 0x18bf3d;
          h2o_context_init(&paVar4->ctx,phVar14,&conf.globalconf);
          phVar3 = conf.threads[(long)pSVar20].ctx.queue;
          (&uStackY_528)[sVar5 * -6] = 0x18bf62;
          h2o_multithread_register_receiver
                    (phVar3,&conf.threads[(long)pSVar20].server_notifications,on_server_notification
                    );
          phVar3 = conf.threads[(long)pSVar20].ctx.queue;
          (&uStackY_528)[sVar5 * -6] = 0x18bf87;
          h2o_multithread_register_receiver
                    (phVar3,&conf.threads[(long)pSVar20].memcached,h2o_memcached_receiver);
          (&uStackY_528)[sVar5 * -6] = 0x18bf8c;
          pVar15 = pthread_self();
          conf.threads[(long)pSVar20].tid = pVar15;
          if (conf.num_listeners != 0) {
            sVar17 = 0;
            plVar18 = listeners;
            lStackY_520.accept_ctx.hosts = pphVar21;
            do {
              plVar2 = conf.listeners[sVar17];
              iVar7 = plVar2->fd;
              if (lStackY_520.accept_ctx.ssl_ctx != (SSL_CTX *)0x0) {
                (&uStackY_528)[sVar5 * -6] = 0x18bfcd;
                iVar7 = dup(iVar7);
                if (iVar7 == -1) {
                  (&uStackY_528)[sVar5 * -6] = 0x18c1af;
                  perror("failed to dup listening socket");
                  (&uStackY_528)[sVar5 * -6] = on_config_listen_enter;
                  abort();
                }
                (&uStackY_528)[sVar5 * -6] = 0x18bfe0;
                set_cloexec(iVar7);
              }
              (plVar18->accept_ctx).libmemcached_receiver = (h2o_multithread_receiver_t *)0x0;
              plVar18->sock = (h2o_socket_t *)0x0;
              (plVar18->accept_ctx).ssl_ctx = (SSL_CTX *)0x0;
              *(undefined8 *)&(plVar18->accept_ctx).expect_proxy_line = 0;
              (plVar18->accept_ctx).ctx = (h2o_context_t *)0x0;
              (plVar18->accept_ctx).hosts = (h2o_hostconf_t **)0x0;
              phVar1 = (h2o_context_t *)
                       ((long)&((conf.threads)->ctx).loop + (long)lStackY_520.accept_ctx.hosts);
              (plVar18->accept_ctx).ctx = phVar1;
              (plVar18->accept_ctx).hosts = plVar2->hosts;
              pphVar21 = lStackY_520.accept_ctx.hosts;
              if ((plVar2->ssl).size != 0) {
                (plVar18->accept_ctx).ssl_ctx = (*(plVar2->ssl).entries)->ctx;
              }
              (plVar18->accept_ctx).expect_proxy_line = plVar2->proxy_protocol;
              (plVar18->accept_ctx).libmemcached_receiver =
                   (h2o_multithread_receiver_t *)
                   ((long)&((conf.threads)->memcached).queue + (long)lStackY_520.accept_ctx.hosts);
              phVar14 = phVar1->loop;
              (&uStackY_528)[sVar5 * -6] = 0x18c054;
              phVar16 = h2o_evloop_socket_create(phVar14,iVar7,0x20);
              plVar18->sock = phVar16;
              phVar16->data = plVar18;
              sVar17 = sVar17 + 1;
              plVar18 = plVar18 + 1;
            } while (sVar17 != conf.num_listeners);
          }
          (&uStackY_528)[sVar5 * -6] = 0x18c077;
          update_listener_state(listeners);
          (&uStackY_528)[sVar5 * -6] = 0x18c083;
          h2o_barrier_wait(&conf.startup_sync_barrier);
          while (conf.shutdown_requested == 0) {
            (&uStackY_528)[sVar5 * -6] = 0x18c094;
            update_listener_state(listeners);
            phVar14 = *(h2o_evloop_t **)((long)&((conf.threads)->ctx).loop + (long)pphVar21);
            (&uStackY_528)[sVar5 * -6] = 0x18c0aa;
            h2o_evloop_run(phVar14,0x7fffffff);
            cache = *(h2o_filecache_t **)
                     ((long)&((conf.threads)->ctx).loop + (long)(pphVar21 + 0x1b));
            (&uStackY_528)[sVar5 * -6] = 0x18c0be;
            h2o_filecache_clear(cache);
          }
          if (lStackY_520.accept_ctx.ssl_ctx == (SSL_CTX *)0x0) {
            (&uStackY_528)[sVar5 * -6] = 0x18c0e7;
            fwrite("received SIGTERM, gracefully shutting down\n",0x2b,1,_stderr);
          }
          if (conf.num_listeners != 0) {
            pphVar19 = &(&lStackY_520)[-sVar5].sock;
            sVar17 = 0;
            do {
              phVar16 = *pphVar19;
              (&uStackY_528)[sVar5 * -6] = 0x18c100;
              h2o_socket_read_stop(phVar16);
              sVar17 = sVar17 + 1;
              pphVar19 = pphVar19 + 6;
            } while (sVar17 != conf.num_listeners);
          }
          phVar14 = *(h2o_evloop_t **)((long)&((conf.threads)->ctx).loop + (long)pphVar21);
          (&uStackY_528)[sVar5 * -6] = 0x18c123;
          h2o_evloop_run(phVar14,0);
          if (conf.num_listeners != 0) {
            pphVar19 = &(&lStackY_520)[-sVar5].sock;
            sVar17 = 0;
            do {
              phVar16 = *pphVar19;
              (&uStackY_528)[sVar5 * -6] = 0x18c13b;
              h2o_socket_close(phVar16);
              *pphVar19 = (h2o_socket_t *)0x0;
              sVar17 = sVar17 + 1;
              pphVar19 = pphVar19 + 6;
            } while (sVar17 != conf.num_listeners);
          }
          (&uStackY_528)[sVar5 * -6] = 0x18c166;
          h2o_context_request_shutdown
                    ((h2o_context_t *)((long)&((conf.threads)->ctx).loop + (long)pphVar21));
          while (conf.state._num_connections != 0) {
            phVar14 = *(h2o_evloop_t **)((long)&((conf.threads)->ctx).loop + (long)pphVar21);
            (&uStackY_528)[sVar5 * -6] = 0x18c189;
            h2o_evloop_run(phVar14,0x7fffffff);
          }
          if (conf.pid_file != (char *)0x0) {
            (&uStackY_528)[sVar5 * -6] = 0x18c19c;
            unlink(conf.pid_file);
          }
          (&uStackY_528)[sVar5 * -6] = 0x18c1a3;
          _exit(0);
        }
        pcStackY_4e0 = (code *)0x18bd53;
        sVar10 = strlen((char *)local_438);
        pcStackY_4e0 = (code *)0x18bd5e;
        sVar11 = strlen(local_498);
        pcStackY_4e0 = (code *)0x18bd6b;
        unaff_R14 = (h2o_iovec_t *)malloc(sVar10 + sVar11 + 0xb);
        if (unaff_R14 == (h2o_iovec_t *)0x0) goto LAB_0018beca;
        pcStackY_4e0 = (code *)0x18bd84;
        pcVar8 = strchr((char *)local_438,0x3a);
        pcVar13 = "--port=[%s]:%s";
        if (pcVar8 == (char *)0x0) {
          pcVar13 = "--port=%s:%s";
        }
        pcStackY_4e0 = (code *)0x18bda5;
        sprintf((char *)unaff_R14,pcVar13,local_438,local_498);
      }
      uVar9 = local_4c8.size + 1;
      if (local_4c8.capacity < uVar9) {
        pcStackY_4e0 = (code *)0x18bdc6;
        h2o_vector__expand((h2o_mem_pool_t *)0x0,&local_4c8,8,uVar9);
        uVar9 = local_4c8.size + 1;
      }
      *(h2o_iovec_t **)((long)local_4c8.entries + local_4c8.size * 8) = unaff_R14;
      sVar17 = sVar17 + 1;
      local_4c8.size = uVar9;
    } while (sVar17 != conf.num_listeners);
  }
  if (local_4c8.capacity < local_4c8.size + 5) {
    pcStackY_4e0 = (code *)0x18be0f;
    h2o_vector__expand((h2o_mem_pool_t *)0x0,&local_4c8,8,local_4c8.size + 5);
  }
  __argv = local_4c8.entries;
  *(char **)((long)local_4c8.entries + local_4c8.size * 8) = "--";
  *(char **)((long)local_4c8.entries + (local_4c8.size + 1) * 8) = local_4a8;
  *(char **)((long)local_4c8.entries + (local_4c8.size + 2) * 8) = "-c";
  *(char **)((long)local_4c8.entries + (local_4c8.size + 3) * 8) = local_4a0;
  *(char **)((long)local_4c8.entries + (local_4c8.size + 4) * 8) = (char *)0x0;
  pcStackY_4e0 = (code *)0x18be7d;
  setenv("H2O_VIA_MASTER","",1);
  pcStackY_4e0 = (code *)0x18be88;
  execvp(*__argv,(char **)__argv);
  __stream = _stderr;
  pcVar8 = *__argv;
  pcStackY_4e0 = (code *)0x18be9a;
  piVar12 = __errno_location();
  pcStackY_4e0 = (code *)0x18bea1;
  pcVar13 = strerror(*piVar12);
  pcStackY_4e0 = (code *)0x18beb8;
  iVar7 = fprintf(__stream,"failed to spawn %s:%s\n",pcVar8,pcVar13);
  return iVar7;
}

Assistant:

static int run_using_server_starter(const char *h2o_cmd, const char *config_file)
{
    char **args = build_server_starter_argv(h2o_cmd, config_file);
    setenv("H2O_VIA_MASTER", "", 1);
    execvp(args[0], args);
    fprintf(stderr, "failed to spawn %s:%s\n", args[0], strerror(errno));
    return EX_CONFIG;
}